

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__vertical_scatter_with_8_coeffs
               (float **outputs,float *vertical_coefficients,float *input,float *input_end)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float r;
  __m128 r0_1;
  __m128 o0_1;
  __m128 r3;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 o3;
  __m128 o2;
  __m128 o1;
  __m128 o0;
  __m128 c7;
  __m128 c6;
  __m128 c5;
  __m128 c4;
  __m128 c3;
  __m128 c2;
  __m128 c1;
  __m128 c0;
  float *pfStack_be8;
  float c7s;
  float *output7;
  float *pfStack_bd8;
  float c6s;
  float *output6;
  float *pfStack_bc8;
  float c5s;
  float *output5;
  float *pfStack_bb8;
  float c4s;
  float *output4;
  float *pfStack_ba8;
  float c3s;
  float *output3;
  float *pfStack_b98;
  float c2s;
  float *output2;
  float *pfStack_b88;
  float c1s;
  float *output1;
  float *pfStack_b78;
  float c0s;
  float *output0;
  float *input_end_local;
  float *input_local;
  float *vertical_coefficients_local;
  float **outputs_local;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  
  pfStack_b78 = *outputs;
  fVar1 = *vertical_coefficients;
  pfStack_b88 = outputs[1];
  fVar2 = vertical_coefficients[1];
  pfStack_b98 = outputs[2];
  fVar3 = vertical_coefficients[2];
  pfStack_ba8 = outputs[3];
  fVar4 = vertical_coefficients[3];
  pfStack_bb8 = outputs[4];
  fVar5 = vertical_coefficients[4];
  pfStack_bc8 = outputs[5];
  fVar6 = vertical_coefficients[5];
  pfStack_bd8 = outputs[6];
  fVar7 = vertical_coefficients[6];
  pfStack_be8 = outputs[7];
  fVar8 = vertical_coefficients[7];
  for (input_end_local = input; 0x3f < (long)input_end - (long)input_end_local;
      input_end_local = input_end_local + 0x10) {
    local_138 = (float)*(undefined8 *)input_end_local;
    fStack_134 = (float)((ulong)*(undefined8 *)input_end_local >> 0x20);
    fStack_130 = (float)*(undefined8 *)(input_end_local + 2);
    fStack_12c = (float)((ulong)*(undefined8 *)(input_end_local + 2) >> 0x20);
    local_158 = (float)*(undefined8 *)(input_end_local + 4);
    fStack_154 = (float)((ulong)*(undefined8 *)(input_end_local + 4) >> 0x20);
    fStack_150 = (float)*(undefined8 *)(input_end_local + 6);
    fStack_14c = (float)((ulong)*(undefined8 *)(input_end_local + 6) >> 0x20);
    local_178 = (float)*(undefined8 *)(input_end_local + 8);
    fStack_174 = (float)((ulong)*(undefined8 *)(input_end_local + 8) >> 0x20);
    fStack_170 = (float)*(undefined8 *)(input_end_local + 10);
    fStack_16c = (float)((ulong)*(undefined8 *)(input_end_local + 10) >> 0x20);
    local_198 = (float)*(undefined8 *)(input_end_local + 0xc);
    fStack_194 = (float)((ulong)*(undefined8 *)(input_end_local + 0xc) >> 0x20);
    fStack_190 = (float)*(undefined8 *)(input_end_local + 0xe);
    fStack_18c = (float)((ulong)*(undefined8 *)(input_end_local + 0xe) >> 0x20);
    *(ulong *)pfStack_b78 = CONCAT44(fStack_134 * fVar1,local_138 * fVar1);
    *(ulong *)(pfStack_b78 + 2) = CONCAT44(fStack_12c * fVar1,fStack_130 * fVar1);
    *(ulong *)(pfStack_b78 + 4) = CONCAT44(fStack_154 * fVar1,local_158 * fVar1);
    *(ulong *)(pfStack_b78 + 6) = CONCAT44(fStack_14c * fVar1,fStack_150 * fVar1);
    *(ulong *)(pfStack_b78 + 8) = CONCAT44(fStack_174 * fVar1,local_178 * fVar1);
    *(ulong *)(pfStack_b78 + 10) = CONCAT44(fStack_16c * fVar1,fStack_170 * fVar1);
    *(ulong *)(pfStack_b78 + 0xc) = CONCAT44(fStack_194 * fVar1,local_198 * fVar1);
    *(ulong *)(pfStack_b78 + 0xe) = CONCAT44(fStack_18c * fVar1,fStack_190 * fVar1);
    *(ulong *)pfStack_b88 = CONCAT44(fStack_134 * fVar2,local_138 * fVar2);
    *(ulong *)(pfStack_b88 + 2) = CONCAT44(fStack_12c * fVar2,fStack_130 * fVar2);
    *(ulong *)(pfStack_b88 + 4) = CONCAT44(fStack_154 * fVar2,local_158 * fVar2);
    *(ulong *)(pfStack_b88 + 6) = CONCAT44(fStack_14c * fVar2,fStack_150 * fVar2);
    *(ulong *)(pfStack_b88 + 8) = CONCAT44(fStack_174 * fVar2,local_178 * fVar2);
    *(ulong *)(pfStack_b88 + 10) = CONCAT44(fStack_16c * fVar2,fStack_170 * fVar2);
    *(ulong *)(pfStack_b88 + 0xc) = CONCAT44(fStack_194 * fVar2,local_198 * fVar2);
    *(ulong *)(pfStack_b88 + 0xe) = CONCAT44(fStack_18c * fVar2,fStack_190 * fVar2);
    *(ulong *)pfStack_b98 = CONCAT44(fStack_134 * fVar3,local_138 * fVar3);
    *(ulong *)(pfStack_b98 + 2) = CONCAT44(fStack_12c * fVar3,fStack_130 * fVar3);
    *(ulong *)(pfStack_b98 + 4) = CONCAT44(fStack_154 * fVar3,local_158 * fVar3);
    *(ulong *)(pfStack_b98 + 6) = CONCAT44(fStack_14c * fVar3,fStack_150 * fVar3);
    *(ulong *)(pfStack_b98 + 8) = CONCAT44(fStack_174 * fVar3,local_178 * fVar3);
    *(ulong *)(pfStack_b98 + 10) = CONCAT44(fStack_16c * fVar3,fStack_170 * fVar3);
    *(ulong *)(pfStack_b98 + 0xc) = CONCAT44(fStack_194 * fVar3,local_198 * fVar3);
    *(ulong *)(pfStack_b98 + 0xe) = CONCAT44(fStack_18c * fVar3,fStack_190 * fVar3);
    *(ulong *)pfStack_ba8 = CONCAT44(fStack_134 * fVar4,local_138 * fVar4);
    *(ulong *)(pfStack_ba8 + 2) = CONCAT44(fStack_12c * fVar4,fStack_130 * fVar4);
    *(ulong *)(pfStack_ba8 + 4) = CONCAT44(fStack_154 * fVar4,local_158 * fVar4);
    *(ulong *)(pfStack_ba8 + 6) = CONCAT44(fStack_14c * fVar4,fStack_150 * fVar4);
    *(ulong *)(pfStack_ba8 + 8) = CONCAT44(fStack_174 * fVar4,local_178 * fVar4);
    *(ulong *)(pfStack_ba8 + 10) = CONCAT44(fStack_16c * fVar4,fStack_170 * fVar4);
    *(ulong *)(pfStack_ba8 + 0xc) = CONCAT44(fStack_194 * fVar4,local_198 * fVar4);
    *(ulong *)(pfStack_ba8 + 0xe) = CONCAT44(fStack_18c * fVar4,fStack_190 * fVar4);
    *(ulong *)pfStack_bb8 = CONCAT44(fStack_134 * fVar5,local_138 * fVar5);
    *(ulong *)(pfStack_bb8 + 2) = CONCAT44(fStack_12c * fVar5,fStack_130 * fVar5);
    *(ulong *)(pfStack_bb8 + 4) = CONCAT44(fStack_154 * fVar5,local_158 * fVar5);
    *(ulong *)(pfStack_bb8 + 6) = CONCAT44(fStack_14c * fVar5,fStack_150 * fVar5);
    *(ulong *)(pfStack_bb8 + 8) = CONCAT44(fStack_174 * fVar5,local_178 * fVar5);
    *(ulong *)(pfStack_bb8 + 10) = CONCAT44(fStack_16c * fVar5,fStack_170 * fVar5);
    *(ulong *)(pfStack_bb8 + 0xc) = CONCAT44(fStack_194 * fVar5,local_198 * fVar5);
    *(ulong *)(pfStack_bb8 + 0xe) = CONCAT44(fStack_18c * fVar5,fStack_190 * fVar5);
    *(ulong *)pfStack_bc8 = CONCAT44(fStack_134 * fVar6,local_138 * fVar6);
    *(ulong *)(pfStack_bc8 + 2) = CONCAT44(fStack_12c * fVar6,fStack_130 * fVar6);
    *(ulong *)(pfStack_bc8 + 4) = CONCAT44(fStack_154 * fVar6,local_158 * fVar6);
    *(ulong *)(pfStack_bc8 + 6) = CONCAT44(fStack_14c * fVar6,fStack_150 * fVar6);
    *(ulong *)(pfStack_bc8 + 8) = CONCAT44(fStack_174 * fVar6,local_178 * fVar6);
    *(ulong *)(pfStack_bc8 + 10) = CONCAT44(fStack_16c * fVar6,fStack_170 * fVar6);
    *(ulong *)(pfStack_bc8 + 0xc) = CONCAT44(fStack_194 * fVar6,local_198 * fVar6);
    *(ulong *)(pfStack_bc8 + 0xe) = CONCAT44(fStack_18c * fVar6,fStack_190 * fVar6);
    *(ulong *)pfStack_bd8 = CONCAT44(fStack_134 * fVar7,local_138 * fVar7);
    *(ulong *)(pfStack_bd8 + 2) = CONCAT44(fStack_12c * fVar7,fStack_130 * fVar7);
    *(ulong *)(pfStack_bd8 + 4) = CONCAT44(fStack_154 * fVar7,local_158 * fVar7);
    *(ulong *)(pfStack_bd8 + 6) = CONCAT44(fStack_14c * fVar7,fStack_150 * fVar7);
    *(ulong *)(pfStack_bd8 + 8) = CONCAT44(fStack_174 * fVar7,local_178 * fVar7);
    *(ulong *)(pfStack_bd8 + 10) = CONCAT44(fStack_16c * fVar7,fStack_170 * fVar7);
    *(ulong *)(pfStack_bd8 + 0xc) = CONCAT44(fStack_194 * fVar7,local_198 * fVar7);
    *(ulong *)(pfStack_bd8 + 0xe) = CONCAT44(fStack_18c * fVar7,fStack_190 * fVar7);
    *(ulong *)pfStack_be8 = CONCAT44(fStack_134 * fVar8,local_138 * fVar8);
    *(ulong *)(pfStack_be8 + 2) = CONCAT44(fStack_12c * fVar8,fStack_130 * fVar8);
    *(ulong *)(pfStack_be8 + 4) = CONCAT44(fStack_154 * fVar8,local_158 * fVar8);
    *(ulong *)(pfStack_be8 + 6) = CONCAT44(fStack_14c * fVar8,fStack_150 * fVar8);
    *(ulong *)(pfStack_be8 + 8) = CONCAT44(fStack_174 * fVar8,local_178 * fVar8);
    *(ulong *)(pfStack_be8 + 10) = CONCAT44(fStack_16c * fVar8,fStack_170 * fVar8);
    *(ulong *)(pfStack_be8 + 0xc) = CONCAT44(fStack_194 * fVar8,local_198 * fVar8);
    *(ulong *)(pfStack_be8 + 0xe) = CONCAT44(fStack_18c * fVar8,fStack_190 * fVar8);
    pfStack_b78 = pfStack_b78 + 0x10;
    pfStack_b88 = pfStack_b88 + 0x10;
    pfStack_b98 = pfStack_b98 + 0x10;
    pfStack_ba8 = pfStack_ba8 + 0x10;
    pfStack_bb8 = pfStack_bb8 + 0x10;
    pfStack_bc8 = pfStack_bc8 + 0x10;
    pfStack_bd8 = pfStack_bd8 + 0x10;
    pfStack_be8 = pfStack_be8 + 0x10;
  }
  for (; 0xf < (long)input_end - (long)input_end_local; input_end_local = input_end_local + 4) {
    local_538 = (float)*(undefined8 *)input_end_local;
    fStack_534 = (float)((ulong)*(undefined8 *)input_end_local >> 0x20);
    fStack_530 = (float)*(undefined8 *)(input_end_local + 2);
    fStack_52c = (float)((ulong)*(undefined8 *)(input_end_local + 2) >> 0x20);
    *(ulong *)pfStack_b78 = CONCAT44(fStack_534 * fVar1,local_538 * fVar1);
    *(ulong *)(pfStack_b78 + 2) = CONCAT44(fStack_52c * fVar1,fStack_530 * fVar1);
    *(ulong *)pfStack_b88 = CONCAT44(fStack_534 * fVar2,local_538 * fVar2);
    *(ulong *)(pfStack_b88 + 2) = CONCAT44(fStack_52c * fVar2,fStack_530 * fVar2);
    *(ulong *)pfStack_b98 = CONCAT44(fStack_534 * fVar3,local_538 * fVar3);
    *(ulong *)(pfStack_b98 + 2) = CONCAT44(fStack_52c * fVar3,fStack_530 * fVar3);
    *(ulong *)pfStack_ba8 = CONCAT44(fStack_534 * fVar4,local_538 * fVar4);
    *(ulong *)(pfStack_ba8 + 2) = CONCAT44(fStack_52c * fVar4,fStack_530 * fVar4);
    *(ulong *)pfStack_bb8 = CONCAT44(fStack_534 * fVar5,local_538 * fVar5);
    *(ulong *)(pfStack_bb8 + 2) = CONCAT44(fStack_52c * fVar5,fStack_530 * fVar5);
    *(ulong *)pfStack_bc8 = CONCAT44(fStack_534 * fVar6,local_538 * fVar6);
    *(ulong *)(pfStack_bc8 + 2) = CONCAT44(fStack_52c * fVar6,fStack_530 * fVar6);
    *(ulong *)pfStack_bd8 = CONCAT44(fStack_534 * fVar7,local_538 * fVar7);
    *(ulong *)(pfStack_bd8 + 2) = CONCAT44(fStack_52c * fVar7,fStack_530 * fVar7);
    *(ulong *)pfStack_be8 = CONCAT44(fStack_534 * fVar8,local_538 * fVar8);
    *(ulong *)(pfStack_be8 + 2) = CONCAT44(fStack_52c * fVar8,fStack_530 * fVar8);
    pfStack_b78 = pfStack_b78 + 4;
    pfStack_b88 = pfStack_b88 + 4;
    pfStack_b98 = pfStack_b98 + 4;
    pfStack_ba8 = pfStack_ba8 + 4;
    pfStack_bb8 = pfStack_bb8 + 4;
    pfStack_bc8 = pfStack_bc8 + 4;
    pfStack_bd8 = pfStack_bd8 + 4;
    pfStack_be8 = pfStack_be8 + 4;
  }
  for (; input_end_local < input_end; input_end_local = input_end_local + 1) {
    fVar9 = *input_end_local;
    *pfStack_b78 = fVar9 * fVar1;
    *pfStack_b88 = fVar9 * fVar2;
    *pfStack_b98 = fVar9 * fVar3;
    *pfStack_ba8 = fVar9 * fVar4;
    *pfStack_bb8 = fVar9 * fVar5;
    *pfStack_bc8 = fVar9 * fVar6;
    *pfStack_bd8 = fVar9 * fVar7;
    *pfStack_be8 = fVar9 * fVar8;
    pfStack_b78 = pfStack_b78 + 1;
    pfStack_b88 = pfStack_b88 + 1;
    pfStack_b98 = pfStack_b98 + 1;
    pfStack_ba8 = pfStack_ba8 + 1;
    pfStack_bb8 = pfStack_bb8 + 1;
    pfStack_bc8 = pfStack_bc8 + 1;
    pfStack_bd8 = pfStack_bd8 + 1;
    pfStack_be8 = pfStack_be8 + 1;
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_scatter_with_,_coeffs)( float ** outputs, float const * vertical_coefficients, float const * input, float const * input_end )
{
  stbIF0( float STBIR_SIMD_STREAMOUT_PTR( * ) output0 = outputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float STBIR_SIMD_STREAMOUT_PTR( * ) output1 = outputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float STBIR_SIMD_STREAMOUT_PTR( * ) output2 = outputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float STBIR_SIMD_STREAMOUT_PTR( * ) output3 = outputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float STBIR_SIMD_STREAMOUT_PTR( * ) output4 = outputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float STBIR_SIMD_STREAMOUT_PTR( * ) output5 = outputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float STBIR_SIMD_STREAMOUT_PTR( * ) output6 = outputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float STBIR_SIMD_STREAMOUT_PTR( * ) output7 = outputs[7]; float c7s = vertical_coefficients[7]; )

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdfX_load( r0, input );               stbir__simdfX_load( r1, input+stbir__simdfX_float_count );     stbir__simdfX_load( r2, input+(2*stbir__simdfX_float_count) );      stbir__simdfX_load( r3, input+(3*stbir__simdfX_float_count) );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output0 );     stbir__simdfX_load( o1, output0+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output0+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );  stbir__simdfX_madd( o2, o2, r2, c0 );   stbir__simdfX_madd( o3, o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_load( o0, output1 );     stbir__simdfX_load( o1, output1+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output1+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );  stbir__simdfX_madd( o2, o2, r2, c1 );   stbir__simdfX_madd( o3, o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_load( o0, output2 );     stbir__simdfX_load( o1, output2+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output2+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );  stbir__simdfX_madd( o2, o2, r2, c2 );   stbir__simdfX_madd( o3, o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_load( o0, output3 );     stbir__simdfX_load( o1, output3+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output3+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );  stbir__simdfX_madd( o2, o2, r2, c3 );   stbir__simdfX_madd( o3, o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_load( o0, output4 );     stbir__simdfX_load( o1, output4+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output4+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );  stbir__simdfX_madd( o2, o2, r2, c4 );   stbir__simdfX_madd( o3, o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_load( o0, output5 );     stbir__simdfX_load( o1, output5+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output5+(2*stbir__simdfX_float_count));    stbir__simdfX_load( o3, output5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );  stbir__simdfX_madd( o2, o2, r2, c5 );   stbir__simdfX_madd( o3, o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_load( o0, output6 );     stbir__simdfX_load( o1, output6+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output6+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );  stbir__simdfX_madd( o2, o2, r2, c6 );   stbir__simdfX_madd( o3, o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_load( o0, output7 );     stbir__simdfX_load( o1, output7+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output7+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );  stbir__simdfX_madd( o2, o2, r2, c7 );   stbir__simdfX_madd( o3, o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #else
      stbIF0( stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );      stbir__simdfX_mult( o2, r2, c0 );       stbir__simdfX_mult( o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_mult( o0, r0, c1 );      stbir__simdfX_mult( o1, r1, c1 );      stbir__simdfX_mult( o2, r2, c1 );       stbir__simdfX_mult( o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_mult( o0, r0, c2 );      stbir__simdfX_mult( o1, r1, c2 );      stbir__simdfX_mult( o2, r2, c2 );       stbir__simdfX_mult( o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_mult( o0, r0, c3 );      stbir__simdfX_mult( o1, r1, c3 );      stbir__simdfX_mult( o2, r2, c3 );       stbir__simdfX_mult( o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_mult( o0, r0, c4 );      stbir__simdfX_mult( o1, r1, c4 );      stbir__simdfX_mult( o2, r2, c4 );       stbir__simdfX_mult( o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_mult( o0, r0, c5 );      stbir__simdfX_mult( o1, r1, c5 );      stbir__simdfX_mult( o2, r2, c5 );       stbir__simdfX_mult( o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_mult( o0, r0, c6 );      stbir__simdfX_mult( o1, r1, c6 );      stbir__simdfX_mult( o2, r2, c6 );       stbir__simdfX_mult( o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_mult( o0, r0, c7 );      stbir__simdfX_mult( o1, r1, c7 );      stbir__simdfX_mult( o2, r2, c7 );       stbir__simdfX_mult( o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #endif

      input += (4*stbir__simdfX_float_count);
      stbIF0( output0 += (4*stbir__simdfX_float_count); ) stbIF1( output1 += (4*stbir__simdfX_float_count); ) stbIF2( output2 += (4*stbir__simdfX_float_count); ) stbIF3( output3 += (4*stbir__simdfX_float_count); ) stbIF4( output4 += (4*stbir__simdfX_float_count); ) stbIF5( output5 += (4*stbir__simdfX_float_count); ) stbIF6( output6 += (4*stbir__simdfX_float_count); ) stbIF7( output7 += (4*stbir__simdfX_float_count); )
    }
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdf_load( r0, input );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output0 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );  stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_load( o0, output1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );  stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_load( o0, output2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );  stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_load( o0, output3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );  stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_load( o0, output4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );  stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_load( o0, output5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );  stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_load( o0, output6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );  stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_load( o0, output7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );  stbir__simdf_store( output7, o0 ); )
      #else
      stbIF0( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );   stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );   stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );   stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );   stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );   stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );   stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );   stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );   stbir__simdf_store( output7, o0 ); )
      #endif

      input += 4;
      stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input_end - (char*) input ) >= 16 )
  {
    float r0, r1, r2, r3;
    STBIR_NO_UNROLL(input);

    r0 = input[0], r1 = input[1], r2 = input[2], r3 = input[3];

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r0 * c0s ); output0[1] += ( r1 * c0s ); output0[2] += ( r2 * c0s ); output0[3] += ( r3 * c0s ); )
    stbIF1( output1[0] += ( r0 * c1s ); output1[1] += ( r1 * c1s ); output1[2] += ( r2 * c1s ); output1[3] += ( r3 * c1s ); )
    stbIF2( output2[0] += ( r0 * c2s ); output2[1] += ( r1 * c2s ); output2[2] += ( r2 * c2s ); output2[3] += ( r3 * c2s ); )
    stbIF3( output3[0] += ( r0 * c3s ); output3[1] += ( r1 * c3s ); output3[2] += ( r2 * c3s ); output3[3] += ( r3 * c3s ); )
    stbIF4( output4[0] += ( r0 * c4s ); output4[1] += ( r1 * c4s ); output4[2] += ( r2 * c4s ); output4[3] += ( r3 * c4s ); )
    stbIF5( output5[0] += ( r0 * c5s ); output5[1] += ( r1 * c5s ); output5[2] += ( r2 * c5s ); output5[3] += ( r3 * c5s ); )
    stbIF6( output6[0] += ( r0 * c6s ); output6[1] += ( r1 * c6s ); output6[2] += ( r2 * c6s ); output6[3] += ( r3 * c6s ); )
    stbIF7( output7[0] += ( r0 * c7s ); output7[1] += ( r1 * c7s ); output7[2] += ( r2 * c7s ); output7[3] += ( r3 * c7s ); )
    #else
    stbIF0( output0[0]  = ( r0 * c0s ); output0[1]  = ( r1 * c0s ); output0[2]  = ( r2 * c0s ); output0[3]  = ( r3 * c0s ); )
    stbIF1( output1[0]  = ( r0 * c1s ); output1[1]  = ( r1 * c1s ); output1[2]  = ( r2 * c1s ); output1[3]  = ( r3 * c1s ); )
    stbIF2( output2[0]  = ( r0 * c2s ); output2[1]  = ( r1 * c2s ); output2[2]  = ( r2 * c2s ); output2[3]  = ( r3 * c2s ); )
    stbIF3( output3[0]  = ( r0 * c3s ); output3[1]  = ( r1 * c3s ); output3[2]  = ( r2 * c3s ); output3[3]  = ( r3 * c3s ); )
    stbIF4( output4[0]  = ( r0 * c4s ); output4[1]  = ( r1 * c4s ); output4[2]  = ( r2 * c4s ); output4[3]  = ( r3 * c4s ); )
    stbIF5( output5[0]  = ( r0 * c5s ); output5[1]  = ( r1 * c5s ); output5[2]  = ( r2 * c5s ); output5[3]  = ( r3 * c5s ); )
    stbIF6( output6[0]  = ( r0 * c6s ); output6[1]  = ( r1 * c6s ); output6[2]  = ( r2 * c6s ); output6[3]  = ( r3 * c6s ); )
    stbIF7( output7[0]  = ( r0 * c7s ); output7[1]  = ( r1 * c7s ); output7[2]  = ( r2 * c7s ); output7[3]  = ( r3 * c7s ); )
    #endif

    input += 4;
    stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input < input_end )
  {
    float r = input[0];
    STBIR_NO_UNROLL(output0);

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r * c0s ); )
    stbIF1( output1[0] += ( r * c1s ); )
    stbIF2( output2[0] += ( r * c2s ); )
    stbIF3( output3[0] += ( r * c3s ); )
    stbIF4( output4[0] += ( r * c4s ); )
    stbIF5( output5[0] += ( r * c5s ); )
    stbIF6( output6[0] += ( r * c6s ); )
    stbIF7( output7[0] += ( r * c7s ); )
    #else
    stbIF0( output0[0]  = ( r * c0s ); )
    stbIF1( output1[0]  = ( r * c1s ); )
    stbIF2( output2[0]  = ( r * c2s ); )
    stbIF3( output3[0]  = ( r * c3s ); )
    stbIF4( output4[0]  = ( r * c4s ); )
    stbIF5( output5[0]  = ( r * c5s ); )
    stbIF6( output6[0]  = ( r * c6s ); )
    stbIF7( output7[0]  = ( r * c7s ); )
    #endif

    ++input;
    stbIF0( ++output0; ) stbIF1( ++output1; ) stbIF2( ++output2; ) stbIF3( ++output3; ) stbIF4( ++output4; ) stbIF5( ++output5; ) stbIF6( ++output6; ) stbIF7( ++output7; )
  }
}